

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void jinit_c_prep_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_c_prep_controller *pjVar1;
  JSAMPARRAY ppJVar2;
  jpeg_component_info *local_30;
  jpeg_component_info *compptr;
  int ci;
  my_prep_ptr prep;
  boolean need_full_buffer_local;
  j_compress_ptr cinfo_local;
  
  if (need_full_buffer != 0) {
    cinfo->err->msg_code = 3;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1 = (jpeg_c_prep_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x70);
  cinfo->prep = pjVar1;
  pjVar1->start_pass = start_pass_prep;
  if (cinfo->downsample->need_context_rows == 0) {
    pjVar1->pre_process_data = pre_process_data;
    compptr._4_4_ = 0;
    local_30 = cinfo->comp_info;
    for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
      ppJVar2 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,
                           (JDIMENSION)
                           ((long)((ulong)local_30->width_in_blocks *
                                   (long)cinfo->min_DCT_h_scaled_size *
                                  (long)cinfo->max_h_samp_factor) / (long)local_30->h_samp_factor),
                           cinfo->max_v_samp_factor);
      (&pjVar1[1].start_pass)[compptr._4_4_] = (_func_void_j_compress_ptr_J_BUF_MODE *)ppJVar2;
      local_30 = local_30 + 1;
    }
  }
  else {
    pjVar1->pre_process_data = pre_process_context;
    create_context_buffer(cinfo);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_prep_controller (j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_prep_ptr prep;
  int ci;
  jpeg_component_info * compptr;

  if (need_full_buffer)		/* safety check */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  prep = (my_prep_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_prep_controller));
  cinfo->prep = (struct jpeg_c_prep_controller *) prep;
  prep->pub.start_pass = start_pass_prep;

  /* Allocate the color conversion buffer.
   * We make the buffer wide enough to allow the downsampler to edge-expand
   * horizontally within the buffer, if it so chooses.
   */
  if (cinfo->downsample->need_context_rows) {
    /* Set up to provide context rows */
#ifdef CONTEXT_ROWS_SUPPORTED
    prep->pub.pre_process_data = pre_process_context;
    create_context_buffer(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* No context, just make it tall enough for one row group */
    prep->pub.pre_process_data = pre_process_data;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      prep->color_buf[ci] = (*cinfo->mem->alloc_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE,
	 (JDIMENSION) (((long) compptr->width_in_blocks *
			cinfo->min_DCT_h_scaled_size *
			cinfo->max_h_samp_factor) / compptr->h_samp_factor),
	 (JDIMENSION) cinfo->max_v_samp_factor);
    }
  }
}